

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  int64_t iVar7;
  void *pvVar8;
  uint uVar9;
  wchar_t wVar10;
  int iVar11;
  size_t min;
  wchar_t wVar12;
  
  if (best_bid < L'!') {
    pvVar4 = a->format->data;
    uVar6 = __archive_read_seek(a,0,2);
    wVar10 = L'\0';
    if (0 < (long)uVar6) {
      min = 0x4000;
      if (uVar6 < 0x4000) {
        min = uVar6;
      }
      iVar7 = __archive_read_seek(a,(long)-(int)min,2);
      wVar10 = L'\0';
      if (-1 < iVar7) {
        wVar10 = L'\0';
        pvVar8 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pvVar8 != (void *)0x0) {
          for (uVar9 = (int)min - 0x16; 0 < (int)uVar9; uVar9 = uVar9 + iVar11) {
            uVar6 = (ulong)uVar9;
            cVar2 = *(char *)((long)pvVar8 + uVar6);
            if (cVar2 == '\x05') {
              iVar11 = -2;
            }
            else if (cVar2 == '\x06') {
              iVar11 = -3;
            }
            else {
              iVar11 = -1;
              if (((cVar2 != 'K') && (iVar11 = -4, cVar2 == 'P')) &&
                 (piVar1 = (int *)((long)pvVar8 + uVar6), *piVar1 == 0x6054b50)) {
                wVar10 = L'\0';
                if ((((short)piVar1[1] == 0) && (*(short *)((long)piVar1 + 6) == 0)) &&
                   (*(short *)((long)piVar1 + 10) == (short)piVar1[2])) {
                  uVar3 = piVar1[3];
                  wVar10 = L'\0';
                  if ((long)((ulong)(uint)piVar1[4] + (ulong)uVar3) <= (long)(iVar7 + uVar6)) {
                    *(ulong *)((long)pvVar4 + 0x18) = (ulong)(uint)piVar1[4];
                    *(ulong *)((long)pvVar4 + 0x20) = (iVar7 + uVar6) - (ulong)uVar3;
                    wVar10 = L' ';
                  }
                }
                if (uVar9 < 0x14) {
                  return wVar10;
                }
                if (piVar1[-5] != 0x7064b50) {
                  return wVar10;
                }
                wVar12 = L'\0';
                if ((piVar1[-4] == 0) && (piVar1[-1] == 1)) {
                  wVar12 = L'\0';
                  iVar7 = __archive_read_seek(a,*(int64_t *)(piVar1 + -3),0);
                  if (-1 < iVar7) {
                    wVar12 = L'\0';
                    pvVar8 = __archive_read_ahead(a,0x38,(ssize_t *)0x0);
                    if ((pvVar8 != (void *)0x0) &&
                       (0xffffffffffffc036 < *(long *)((long)pvVar8 + 4) - 0x3ff5U)) {
                      wVar12 = L'\0';
                      pvVar8 = __archive_read_ahead
                                         (a,*(long *)((long)pvVar8 + 4) + 0xc,(ssize_t *)0x0);
                      if ((pvVar8 != (void *)0x0) &&
                         (((*(int *)((long)pvVar8 + 0x10) == 0 &&
                           (*(int *)((long)pvVar8 + 0x14) == 0)) &&
                          (*(long *)((long)pvVar8 + 0x18) == *(long *)((long)pvVar8 + 0x20))))) {
                        wVar12 = L' ';
                        uVar5 = *(undefined8 *)((long)pvVar8 + 0x30);
                        *(undefined8 *)((long)pvVar4 + 0x18) = uVar5;
                        *(undefined8 *)((long)pvVar4 + 0x20) = uVar5;
                      }
                    }
                  }
                }
                if ((uint)wVar12 <= (uint)wVar10) {
                  return wVar10;
                }
                return wVar12;
              }
            }
          }
        }
      }
    }
  }
  else {
    wVar10 = L'\xffffffff';
  }
  return wVar10;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) */
	tail = (int)zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* Boyer-Moore search backwards from the end, since we want
	 * to match the last EOCD in the file (there can be more than
	 * one if there is an uncompressed Zip archive as a member
	 * within this Zip archive). */
	for (i = tail - 22; i > 0;) {
		switch (p[i]) {
		case 'P':
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i,
				    current_offset + i);
				/* Zip64 EOCD locator precedes
				 * regular EOCD if present. */
				if (i >= 20 && memcmp(p + i - 20, "PK\006\007", 4) == 0) {
					int ret_zip64 = read_zip64_eocd(a, zip, p + i - 20);
					if (ret_zip64 > ret)
						ret = ret_zip64;
				}
				return (ret);
			}
			i -= 4;
			break;
		case 'K': i -= 1; break;
		case 005: i -= 2; break;
		case 006: i -= 3; break;
		default: i -= 4; break;
		}
	}
	return 0;
}